

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mddglobals.cpp
# Opt level: O2

void addMDDProp(vec<IntVar_*> *x,MDDTable *tab,MDDNodeInt m,MDDOpts *mopts)

{
  ulong uVar1;
  MDDTemplate *this;
  MDDProp<0> *this_00;
  uint i_1;
  uint i;
  ulong uVar2;
  uint i_2;
  IntView<0> local_88;
  vec<IntView<0>_> local_78;
  vec<int> local_68;
  MDDOpts *local_50;
  vec<std::pair<int,_int>_> local_48;
  
  local_68.sz = 0;
  local_68.cap = 0;
  local_68.data = (int *)0x0;
  local_78.sz = 0;
  local_78.cap = 0;
  local_78.data = (IntView<0> *)0x0;
  local_48.sz = 0;
  local_48.cap = 0;
  local_48.data = (pair<int,_int> *)0x0;
  local_50 = mopts;
  for (uVar2 = 0; uVar1 = (ulong)x->sz, uVar2 < uVar1; uVar2 = uVar2 + 1) {
    local_88.var = *(IntVar **)&x->data[uVar2]->min;
    vec<std::pair<int,_int>_>::push(&local_48,(pair<int,_int> *)&local_88);
    local_88.var = (IntVar *)CONCAT44(local_88.var._4_4_,(x->data[uVar2]->max).v + 1);
    vec<int>::push(&local_68,(int *)&local_88);
  }
  for (uVar2 = 0; uVar2 < uVar1; uVar2 = uVar2 + 1) {
    IntVar::specialiseToEL(x->data[uVar2]);
    uVar1 = (ulong)x->sz;
  }
  for (uVar2 = 0; uVar2 < uVar1; uVar2 = uVar2 + 1) {
    local_88.var = x->data[uVar2];
    local_88.a = 1;
    local_88.b = 0;
    vec<IntView<0>_>::push(&local_78,&local_88);
    uVar1 = (ulong)x->sz;
  }
  this = (MDDTemplate *)operator_new(0x70);
  MDDTemplate::MDDTemplate(this,tab,m,&local_68);
  this_00 = (MDDProp<0> *)operator_new(0xf0);
  MDDProp<0>::MDDProp(this_00,this,&local_78,local_50);
  free(local_48.data);
  free(local_78.data);
  free(local_68.data);
  return;
}

Assistant:

static void addMDDProp(vec<IntVar*>& x, MDDTable& tab, MDDNodeInt m, const MDDOpts& mopts) {
	vec<int> doms;
	vec<IntView<> > w;

	vec<intpair> bounds;
	for (unsigned int i = 0; i < x.size(); i++) {
		bounds.push(intpair(x[i]->getMin(), x[i]->getMax()));
		doms.push(x[i]->getMax() + 1);
		// assert( x[i]->getMin() == 0 );
	}
	//   m = tab.bound(m, bounds);
	//   m = tab.expand(0, m);

	for (unsigned int i = 0; i < x.size(); i++) {
		x[i]->specialiseToEL();
	}
	for (unsigned int i = 0; i < x.size(); i++) {
		w.push(IntView<>(x[i], 1, 0));
	}

	auto* templ = new MDDTemplate(tab, m, doms);

	new MDDProp<0>(templ, w, mopts);
}